

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall S2Polygon::InitIndex(S2Polygon *this)

{
  bool bVar1;
  pointer *__ptr;
  _Head_base<0UL,_S2Shape_*,_false> local_38;
  S2Shape *local_30;
  ostream *local_28;
  S2Polygon *local_20;
  
  if ((int)((ulong)((long)(this->index_).shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->index_).shapes_.
                         super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
    local_20 = this;
    absl::make_unique<S2Polygon::Shape,S2Polygon*>((absl *)&local_30,&local_20);
    local_38._M_head_impl = local_30;
    local_30 = (S2Shape *)0x0;
    MutableS2ShapeIndex::Add
              (&this->index_,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_38);
    if (local_38._M_head_impl != (S2Shape *)0x0) {
      (*(local_38._M_head_impl)->_vptr_S2Shape[1])();
    }
    local_38._M_head_impl = (S2Shape *)0x0;
    if (local_30 != (S2Shape *)0x0) {
      (*local_30->_vptr_S2Shape[1])();
    }
    if (FLAGS_s2polygon_lazy_indexing == false) {
      MutableS2ShapeIndex::ForceBuild(&this->index_);
    }
    if (((FLAGS_s2debug == true) && (this->s2debug_override_ == ALLOW)) &&
       (bVar1 = IsValid(this), !bVar1)) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                 ,0x137,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(local_28,"Check failed: IsValid() ",0x18);
      if (!bVar1) goto LAB_0020aa97;
    }
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x130,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_28,"Check failed: (0) == (index_.num_shape_ids()) ",0x2e);
LAB_0020aa97:
  abort();
}

Assistant:

void S2Polygon::InitToUnion(
    const S2Polygon& a, const S2Polygon& b,
    const S2Builder::SnapFunction& snap_function) {
  InitToOperation(S2BooleanOperation::OpType::UNION, snap_function, a, b);
}